

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDIOAnalyzerResults.cpp
# Opt level: O0

void __thiscall
MDIOAnalyzerResults::GenerateFrameTabularText
          (MDIOAnalyzerResults *this,U64 frame_index,DisplayBase display_base)

{
  char local_658 [8];
  char number_str_11 [128];
  char number_str_10 [128];
  char number_str_9 [128];
  char number_str_8 [128];
  char number_str_7 [128];
  char number_str_6 [128];
  char number_str_5 [128];
  char number_str_4 [128];
  char number_str_3 [128];
  char number_str_2 [128];
  char number_str_1 [128];
  char number_str [128];
  Frame local_48 [8];
  Frame frame;
  ulonglong local_38;
  undefined1 local_28;
  byte local_27;
  DisplayBase display_base_local;
  U64 frame_index_local;
  MDIOAnalyzerResults *this_local;
  
  AnalyzerResults::ClearTabularText();
  AnalyzerResults::GetFrame((ulonglong)local_48);
  switch(local_28) {
  case 0:
    AnalyzerResults::AddTabularText((char *)this,"START C","22",(char *)0x0,(char *)0x0,(char *)0x0)
    ;
    break;
  case 1:
    AnalyzerResults::AddTabularText((char *)this,"START C","45",(char *)0x0,(char *)0x0,(char *)0x0)
    ;
    break;
  case 2:
    AnalyzerResults::AddTabularText((char *)this,"OPCODE [","Write","]",(char *)0x0,(char *)0x0);
    break;
  case 3:
    AnalyzerResults::AddTabularText((char *)this,"OPCODE [","Read","]",(char *)0x0,(char *)0x0);
    break;
  case 4:
    AnalyzerResults::AddTabularText((char *)this,"OPCODE [","Address","]",(char *)0x0,(char *)0x0);
    break;
  case 5:
    AnalyzerResults::AddTabularText
              ((char *)this,"OPCODE [","Read-Increment-Address","]",(char *)0x0,(char *)0x0);
    break;
  case 6:
    AnalyzerHelpers::GetNumberString(local_38,display_base,5,number_str_1 + 0x78,0x80);
    AnalyzerResults::AddTabularText
              ((char *)this,"PHY Address [",number_str_1 + 0x78,"]",(char *)0x0,(char *)0x0);
    break;
  case 7:
    AnalyzerHelpers::GetNumberString(local_38,display_base,5,number_str_2 + 0x78,0x80);
    AnalyzerResults::AddTabularText
              ((char *)this,"Register Address [",number_str_2 + 0x78,"]",(char *)0x0,(char *)0x0);
    break;
  case 8:
    AnalyzerHelpers::GetNumberString(local_38,display_base,5,number_str_3 + 0x78,0x80);
    AnalyzerResults::AddTabularText
              ((char *)this,"DEVTYPE [","Reserved","] - ",number_str_3 + 0x78,(char *)0x0);
    break;
  case 9:
    AnalyzerHelpers::GetNumberString(local_38,display_base,5,number_str_4 + 0x78,0x80);
    AnalyzerResults::AddTabularText
              ((char *)this,"DEVTYPE [","PMD/PMA","] - ",number_str_4 + 0x78,(char *)0x0);
    break;
  case 10:
    AnalyzerHelpers::GetNumberString(local_38,display_base,5,number_str_5 + 0x78,0x80);
    AnalyzerResults::AddTabularText
              ((char *)this,"DEVTYPE [","WIS","] - ",number_str_5 + 0x78,(char *)0x0);
    break;
  case 0xb:
    AnalyzerHelpers::GetNumberString(local_38,display_base,5,number_str_6 + 0x78,0x80);
    AnalyzerResults::AddTabularText
              ((char *)this,"DEVTYPE [","PCS","] - ",number_str_6 + 0x78,(char *)0x0);
    break;
  case 0xc:
    AnalyzerHelpers::GetNumberString(local_38,display_base,5,number_str_7 + 0x78,0x80);
    AnalyzerResults::AddTabularText
              ((char *)this,"DEVTYPE [","PHY XS","] - ",number_str_7 + 0x78,(char *)0x0);
    break;
  case 0xd:
    AnalyzerHelpers::GetNumberString(local_38,display_base,5,number_str_8 + 0x78,0x80);
    AnalyzerResults::AddTabularText
              ((char *)this,"DEVTYPE [","DTE XS","] - ",number_str_8 + 0x78,(char *)0x0);
    break;
  case 0xe:
    AnalyzerHelpers::GetNumberString(local_38,display_base,5,number_str_9 + 0x78,0x80);
    AnalyzerResults::AddTabularText
              ((char *)this,"DEVTYPE [","Other","] - ",number_str_9 + 0x78,(char *)0x0);
    break;
  case 0xf:
    if ((local_27 & 0x80) == 0) {
      AnalyzerResults::AddTabularText
                ((char *)this,"Turnaround",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddTabularText
                ((char *)this,"!Turnaround",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    break;
  case 0x10:
    AnalyzerHelpers::GetNumberString(local_38,display_base,0x10,number_str_10 + 0x78,0x80);
    AnalyzerResults::AddTabularText
              ((char *)this,"Data [",number_str_10 + 0x78,"]",(char *)0x0,(char *)0x0);
    break;
  case 0x11:
    AnalyzerHelpers::GetNumberString(local_38,display_base,0x10,number_str_11 + 0x78,0x80);
    AnalyzerResults::AddTabularText
              ((char *)this,"Address"," [",number_str_11 + 0x78,"]",(char *)0x0);
    break;
  case 0x12:
    AnalyzerHelpers::GetNumberString(local_38,display_base,0x10,local_658,0x80);
    AnalyzerResults::AddTabularText((char *)this,"Data"," [",local_658,"]",(char *)0x0);
    break;
  case 0x13:
    AnalyzerResults::AddTabularText
              ((char *)this,"!Unknown",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  }
  Frame::~Frame(local_48);
  return;
}

Assistant:

void MDIOAnalyzerResults::GenerateFrameTabularText( U64 frame_index, DisplayBase display_base )
{
    ClearTabularText();

    Frame frame = GetFrame( frame_index );

    switch( frame.mType )
    {
    case MDIO_C22_START:
        AddTabularText( "START C", "22" );
        break;

    case MDIO_C45_START:
        AddTabularText( "START C", "45" );
        break;

    case MDIO_OP_W:
        AddTabularText( "OPCODE [", "Write", "]" );
        break;

    case MDIO_OP_R:
        AddTabularText( "OPCODE [", "Read", "]" );
        break;

    case MDIO_C45_OP_ADDR:
        AddTabularText( "OPCODE [", "Address", "]" );
        break;

    case MDIO_C45_OP_READ_INC_ADDR:
        AddTabularText( "OPCODE [", "Read-Increment-Address", "]" );
        break;

    case MDIO_PHYADDR:
    {
        char number_str[ 128 ];
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 5, number_str, 128 );
        AddTabularText( "PHY Address [", number_str, "]" );
    }
    break;

    case MDIO_C22_REGADDR:
    {
        char number_str[ 128 ];
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 5, number_str, 128 );
        AddTabularText( "Register Address [", number_str, "]" );
    }
    break;

    case MDIO_C45_DEVTYPE_RESERVED:
    {
        char number_str[ 128 ];
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 5, number_str, 128 );
        AddTabularText( "DEVTYPE [", "Reserved", "] - ", number_str );
    }
    break;

    case MDIO_C45_DEVTYPE_PMD_PMA:
    {
        char number_str[ 128 ];
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 5, number_str, 128 );
        AddTabularText( "DEVTYPE [", "PMD/PMA", "] - ", number_str );
    }
    break;

    case MDIO_C45_DEVTYPE_WIS:
    {
        char number_str[ 128 ];
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 5, number_str, 128 );
        AddTabularText( "DEVTYPE [", "WIS", "] - ", number_str );
    }
    break;

    case MDIO_C45_DEVTYPE_PCS:
    {
        char number_str[ 128 ];
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 5, number_str, 128 );
        AddTabularText( "DEVTYPE [", "PCS", "] - ", number_str );
    }
    break;
    case MDIO_C45_DEVTYPE_PHY_XS:
    {
        char number_str[ 128 ];
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 5, number_str, 128 );
        AddTabularText( "DEVTYPE [", "PHY XS", "] - ", number_str );
    }
    break;
    case MDIO_C45_DEVTYPE_DTE_XS:
    {
        char number_str[ 128 ];
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 5, number_str, 128 );
        AddTabularText( "DEVTYPE [", "DTE XS", "] - ", number_str );
    }
    break;
    case MDIO_C45_DEVTYPE_OTHER:
    {
        char number_str[ 128 ];
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 5, number_str, 128 );
        AddTabularText( "DEVTYPE [", "Other", "] - ", number_str );
    }
    break;
    case MDIO_TA:
        if( frame.mFlags & DISPLAY_AS_ERROR_FLAG )
        {
            AddTabularText( "!Turnaround" );
        }
        else
        {
            AddTabularText( "Turnaround" );
        }
        break;

    case MDIO_C22_DATA:
    {
        char number_str[ 128 ];
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 16, number_str, 128 );
        AddTabularText( "Data [", number_str, "]" );
    }
    break;

    case MDIO_C45_ADDR:
    {
        char number_str[ 128 ];
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 16, number_str, 128 );
        AddTabularText( "Address", " [", number_str, "]" );
    }
    break;

    case MDIO_C45_DATA:
    {
        char number_str[ 128 ];
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 16, number_str, 128 );
        AddTabularText( "Data", " [", number_str, "]" );
    }
    break;

    case MDIO_UNKNOWN:
        AddTabularText( "!Unknown" );
        break;
    }
}